

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

int jbcoin::Serializer::decodeLengthLength(int b1)

{
  int local_c;
  int b1_local;
  
  if (b1 < 0) {
    Throw<std::overflow_error,char_const(&)[5]>((char (*) [5])"b1<0");
  }
  if (b1 < 0xc1) {
    local_c = 1;
  }
  else if (b1 < 0xf1) {
    local_c = 2;
  }
  else {
    if (0xfe < b1) {
      Throw<std::overflow_error,char_const(&)[7]>((char (*) [7])"b1>254");
    }
    local_c = 3;
  }
  return local_c;
}

Assistant:

int Serializer::decodeLengthLength (int b1)
{
    if (b1 < 0) Throw<std::overflow_error> ("b1<0");

    if (b1 <= 192) return 1;

    if (b1 <= 240) return 2;

    if (b1 <= 254) return 3;

    Throw<std::overflow_error> ("b1>254");
    return 0; // Silence compiler warning.
}